

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O3

CURLcode Curl_pp_flushsend(pingpong *pp)

{
  CURLcode CVar1;
  size_t sVar2;
  curltime cVar3;
  ssize_t written;
  long local_20;
  
  CVar1 = Curl_write(pp->conn,pp->conn->sock[0],pp->sendthis + (pp->sendsize - pp->sendleft),
                     pp->sendleft,&local_20);
  if (CVar1 == CURLE_OK) {
    sVar2 = pp->sendleft - local_20;
    if (sVar2 == 0) {
      (*Curl_cfree)(pp->sendthis);
      pp->sendthis = (char *)0x0;
      pp->sendleft = 0;
      pp->sendsize = 0;
      cVar3 = Curl_now();
      (pp->response).tv_sec = cVar3.tv_sec;
      (pp->response).tv_usec = cVar3.tv_usec;
    }
    else {
      pp->sendleft = sVar2;
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_pp_flushsend(struct pingpong *pp)
{
  /* we have a piece of a command still left to send */
  struct connectdata *conn = pp->conn;
  ssize_t written;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  CURLcode result = Curl_write(conn, sock, pp->sendthis + pp->sendsize -
                               pp->sendleft, pp->sendleft, &written);
  if(result)
    return result;

  if(written != (ssize_t)pp->sendleft) {
    /* only a fraction was sent */
    pp->sendleft -= written;
  }
  else {
    free(pp->sendthis);
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }
  return CURLE_OK;
}